

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_> * __thiscall
chaiscript::AST_Node_Trace::get_children
          (vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
           *__return_storage_ptr__,AST_Node_Trace *this,AST_Node *node)

{
  allocator<chaiscript::AST_Node_Trace> local_49;
  __normal_iterator<const_std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
  local_48;
  __normal_iterator<const_std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
  local_40;
  undefined1 local_38 [8];
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  node_children;
  AST_Node *node_local;
  AST_Node_Trace *this_local;
  
  node_children.
  super__Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)node;
  (**node->_vptr_AST_Node)();
  local_40._M_current =
       (reference_wrapper<chaiscript::AST_Node> *)
       std::
       vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
       ::begin((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
                *)local_38);
  local_48._M_current =
       (reference_wrapper<chaiscript::AST_Node> *)
       std::
       vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
       ::end((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
              *)local_38);
  std::allocator<chaiscript::AST_Node_Trace>::allocator(&local_49);
  std::vector<chaiscript::AST_Node_Trace,std::allocator<chaiscript::AST_Node_Trace>>::
  vector<__gnu_cxx::__normal_iterator<std::reference_wrapper<chaiscript::AST_Node>const*,std::vector<std::reference_wrapper<chaiscript::AST_Node>,std::allocator<std::reference_wrapper<chaiscript::AST_Node>>>>,void>
            ((vector<chaiscript::AST_Node_Trace,std::allocator<chaiscript::AST_Node_Trace>> *)
             __return_storage_ptr__,local_40,local_48,&local_49);
  std::allocator<chaiscript::AST_Node_Trace>::~allocator(&local_49);
  std::
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ::~vector((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AST_Node_Trace> get_children(const AST_Node &node) {
      const auto node_children = node.get_children();
      return std::vector<AST_Node_Trace>(node_children.begin(), node_children.end());
    }